

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.h
# Opt level: O3

void __thiscall L14_1::Student::~Student(Student *this)

{
  pointer pcVar1;
  
  operator_delete((this->_scores)._M_data);
  pcVar1 = (this->_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Student() {}